

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O3

void __thiscall rudp::session::update_receive_head(session *this,outiter_t *received)

{
  uint8_t *puVar1;
  byte bVar2;
  element_type *peVar3;
  ulong uVar4;
  uint8_t uVar5;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *psVar6;
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
  *paVar7;
  uint8_t uVar8;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *u;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *psVar9;
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL> *u_00
  ;
  iterator head_iter;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
  *local_40;
  uint local_34;
  
  puVar1 = &this->receive_head;
  bVar2 = this->receive_head;
  psVar9 = (this->receive_buffer)._M_elems + bVar2;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar6 = std::
           __find_if<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const>>
                     (psVar9,puVar1);
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  local_40 = &this->receive_buffer;
  u = psVar9;
  local_34 = (uint)bVar2;
  if (psVar9 != psVar6) {
    do {
      peVar3 = (u->
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      if (((peVar3 != (element_type *)0x0) &&
          (uVar4 = (peVar3->
                   super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                   ).m_holder.m_size, 2 < uVar4)) &&
         (*(uchar *)((long)(peVar3->
                           super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                           ).m_holder.
                           super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage.
                           aligner.data + 1) < uVar4)) {
        boost::container::
        vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
        ::
        priv_push_back<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&>
                  ((vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
                    *)received->container,u);
      }
      u = u + 1;
    } while (u != psVar6);
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (psVar9 != psVar6) {
      do {
        (psVar9->
        super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(psVar9->
                    super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,a_Stack_50);
        psVar9 = psVar9 + 1;
      } while (psVar9 != psVar6);
      if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
      }
    }
  }
  u_00 = local_40;
  uVar8 = (uint8_t)((uint)((int)psVar6 - (int)local_40) >> 4);
  *puVar1 = uVar8;
  if (psVar6 == (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)puVar1)
  {
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psVar6 = std::
             __find_if<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const>>
                       (local_40,puVar1);
    if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
    }
    if (u_00 != (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                 *)psVar6) {
      do {
        peVar3 = u_00->_M_elems[0].
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (((peVar3 != (element_type *)0x0) &&
            (uVar4 = (peVar3->
                     super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                     ).m_holder.m_size, 2 < uVar4)) &&
           (*(byte *)((long)&(peVar3->
                             super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                             ).m_holder.
                             super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.
                             storage + 1) < uVar4)) {
          boost::container::
          vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
          ::
          priv_push_back<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&>
                    ((vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
                      *)received->container,u_00->_M_elems);
        }
        u_00 = (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                *)(u_00->_M_elems + 1);
      } while (u_00 != (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                        *)psVar6);
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      u_00 = local_40;
      if (local_40 !=
          (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
           *)psVar6) {
        paVar7 = local_40;
        do {
          paVar7->_M_elems[0].
          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&paVar7->_M_elems[0].
                      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,a_Stack_50);
          u_00 = local_40;
          paVar7 = (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                    *)(&paVar7->_M_elems[0].
                        super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                      + 1);
        } while (paVar7 != (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                            *)psVar6);
        if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
        }
      }
    }
    uVar8 = (uint8_t)((uint)((int)psVar6 - (int)u_00) >> 4);
    *puVar1 = uVar8;
  }
  uVar5 = this->out_of_sequence_count + '\x01';
  if ((uint8_t)local_34 != uVar8) {
    uVar5 = '\0';
  }
  this->out_of_sequence_count = uVar5;
  return;
}

Assistant:

void session::update_receive_head( outiter_t &received ) {
    const auto old_receive_head = receive_head;
    const auto head_iter = std::next( receive_buffer.begin(), receive_head );
    const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
    for( auto iter = head_iter; iter != end_iter; ++iter ) {
      if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
        *received = *iter;
	       ++received;
      }
    }
    std::fill( head_iter, end_iter, buffer_ptr_t() );
    receive_head = std::distance( receive_buffer.begin(), end_iter );
    if( end_iter == receive_buffer.end() ) {
      const auto head_iter = receive_buffer.begin();
      const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
      for( auto iter = head_iter; iter != end_iter; ++iter ) {
        if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
          *received = *iter;
          ++received;
        }
      }
      std::fill( head_iter, end_iter, buffer_ptr_t() );
      receive_head = std::distance( receive_buffer.begin(), end_iter );
    }
    if( old_receive_head == receive_head ) ++out_of_sequence_count;
    else out_of_sequence_count = 0;
  }